

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondJump.cpp
# Opt level: O3

void __thiscall
OpenMD::HBondJump::processOverlapping(HBondJump *this,int frame,SelectionManager *sman)

{
  ulong *puVar1;
  int iVar2;
  int iVar3;
  pointer ppAVar4;
  pointer pvVar5;
  pointer ppHVar6;
  long lVar7;
  long lVar8;
  Molecule *pMVar9;
  Molecule *pMVar10;
  int iVar11;
  pointer ppAVar12;
  HBondDonor *pHVar13;
  pointer ppHVar14;
  Atom *pAVar15;
  long lVar16;
  int i;
  int j;
  int local_68;
  int local_64;
  pointer local_60;
  HBondJump *local_58;
  long local_50;
  SelectionManager *local_48;
  long local_40;
  Molecule *local_38;
  
  local_58 = this;
  pMVar9 = SelectionManager::beginSelectedMolecule(sman,&local_68);
  if (pMVar9 != (Molecule *)0x0) {
    lVar16 = (long)frame * 0x18;
    local_50 = (long)frame * 0x28;
    local_48 = sman;
    local_40 = lVar16;
    do {
      ppAVar12 = (pointer)(pMVar9->hBondDonors_).
                          super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start;
      ppAVar4 = local_60;
      pMVar10 = local_38;
      if (ppAVar12 !=
          (pointer)(pMVar9->hBondDonors_).
                   super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
        pAVar15 = *ppAVar12;
        while (local_38 = pMVar9, local_60 = ppAVar12, pMVar9 = local_38, pAVar15 != (Atom *)0x0) {
          iVar2 = *(int *)(*(long *)((long)&(((local_58->GIDtoH_).
                                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                            super__Vector_impl_data + lVar16) +
                          (long)*(int *)(*(long *)&(pAVar15->super_StuntDouble).objType_ + 0x28) * 4
                          );
          iVar3 = *(int *)(*(long *)((long)&(((local_58->acceptor_).
                                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                            super__Vector_impl_data + lVar16) + (long)iVar2 * 4);
          local_64 = local_68;
          pMVar9 = SelectionManager::nextSelectedMolecule(sman,&local_64);
          if (pMVar9 != (Molecule *)0x0) {
            iVar11 = iVar2 + 0x3f;
            if (-1 < iVar2) {
              iVar11 = iVar2;
            }
            do {
              ppAVar12 = (pMVar9->hBondAcceptors_).
                         super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl
                         .super__Vector_impl_data._M_start;
              ppAVar4 = (pMVar9->hBondAcceptors_).
                        super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              if ((ppAVar12 != ppAVar4) && (pAVar15 = *ppAVar12, pAVar15 != (Atom *)0x0)) {
                pvVar5 = (local_58->selected_).
                         super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                do {
                  ppAVar12 = ppAVar12 + 1;
                  if ((pAVar15->super_StuntDouble).globalIndex_ == iVar3) {
                    puVar1 = (ulong *)((ulong)(((long)iVar2 & 0x800000000000003fU) <
                                              0x8000000000000001) * 8 + -8 +
                                      *(long *)((long)&(pvVar5->
                                                  super__Bvector_base<std::allocator<bool>_>).
                                                  _M_impl.super__Bvector_impl_data + local_50) +
                                      (long)(iVar11 >> 6) * 8);
                    *puVar1 = *puVar1 | 1L << ((byte)iVar2 & 0x3f);
                  }
                } while ((ppAVar12 != ppAVar4) && (pAVar15 = *ppAVar12, pAVar15 != (Atom *)0x0));
              }
              pMVar9 = SelectionManager::nextSelectedMolecule(local_48,&local_64);
            } while (pMVar9 != (Molecule *)0x0);
          }
          ppAVar12 = local_60 + 1;
          sman = local_48;
          pMVar9 = local_38;
          lVar16 = local_40;
          ppAVar4 = local_60;
          pMVar10 = local_38;
          if (ppAVar12 ==
              (pointer)(local_38->hBondDonors_).
                       super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish) break;
          pAVar15 = *ppAVar12;
        }
      }
      local_38 = pMVar10;
      local_60 = ppAVar4;
      ppAVar12 = (pMVar9->hBondAcceptors_).
                 super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      while ((ppAVar12 !=
              (pMVar9->hBondAcceptors_).
              super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
              super__Vector_impl_data._M_finish && (*ppAVar12 != (Atom *)0x0))) {
        iVar2 = ((*ppAVar12)->super_StuntDouble).globalIndex_;
        local_64 = local_68;
        local_60 = ppAVar12;
        while (pMVar10 = SelectionManager::nextSelectedMolecule(sman,&local_64),
              pMVar10 != (Molecule *)0x0) {
          ppHVar14 = (pMVar10->hBondDonors_).
                     super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppHVar6 = (pMVar10->hBondDonors_).
                    super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if ((ppHVar14 != ppHVar6) && (pHVar13 = *ppHVar14, pHVar13 != (HBondDonor *)0x0)) {
            lVar7 = *(long *)((long)&(((local_58->GIDtoH_).
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                     super__Vector_impl_data + lVar16);
            lVar8 = *(long *)((long)&(((local_58->acceptor_).
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                     super__Vector_impl_data + lVar16);
            pvVar5 = (local_58->selected_).
                     super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            do {
              ppHVar14 = ppHVar14 + 1;
              iVar3 = *(int *)(lVar7 + (long)(pHVar13->donatedHydrogen->super_StuntDouble).
                                             globalIndex_ * 4);
              if (*(int *)(lVar8 + (long)iVar3 * 4) == iVar2) {
                iVar11 = iVar3 + 0x3f;
                if (-1 < iVar3) {
                  iVar11 = iVar3;
                }
                puVar1 = (ulong *)((long)(iVar11 >> 6) * 8 +
                                   *(long *)((long)&(pvVar5->
                                                  super__Bvector_base<std::allocator<bool>_>).
                                                  _M_impl.super__Bvector_impl_data + local_50) + -8
                                  + (ulong)(((long)iVar3 & 0x800000000000003fU) < 0x8000000000000001
                                           ) * 8);
                *puVar1 = *puVar1 | 1L << ((byte)iVar3 & 0x3f);
              }
            } while ((ppHVar14 != ppHVar6) && (pHVar13 = *ppHVar14, pHVar13 != (HBondDonor *)0x0));
          }
        }
        ppAVar12 = local_60 + 1;
      }
      pMVar9 = SelectionManager::nextSelectedMolecule(sman,&local_68);
    } while (pMVar9 != (Molecule *)0x0);
  }
  return;
}

Assistant:

void HBondJump::processOverlapping(int frame, SelectionManager& sman) {
    Molecule* mol1;
    Molecule* mol2;
    int i, j;

    std::vector<Molecule::HBondDonor*>::iterator hbdi;
    Molecule::HBondDonor* hbd;
    std::vector<Atom*>::iterator hbai;
    Atom* hba;
    int hInd, index, aInd;

    // This is the same as a pairwise loop structure:
    // for (int i = 0;  i < n-1 ; ++i ) {
    //   for (int j = i + 1; j < n; ++j) {}
    // }

    for (mol1 = sman.beginSelectedMolecule(i); mol1 != NULL;
         mol1 = sman.nextSelectedMolecule(i)) {
      // loop over the possible donors in molecule 1:
      for (hbd = mol1->beginHBondDonor(hbdi); hbd != NULL;
           hbd = mol1->nextHBondDonor(hbdi)) {
        hInd  = hbd->donatedHydrogen->getGlobalIndex();
        index = GIDtoH_[frame][hInd];
        aInd  = acceptor_[frame][index];

        for (j = i, mol2 = sman.nextSelectedMolecule(j); mol2 != NULL;
             mol2 = sman.nextSelectedMolecule(j)) {
          for (hba = mol2->beginHBondAcceptor(hbai); hba != NULL;
               hba = mol2->nextHBondAcceptor(hbai)) {
            if (hba->getGlobalIndex() == aInd) {
              selected_[frame][index] = true;
            }
          }
        }
      }

      for (hba = mol1->beginHBondAcceptor(hbai); hba != NULL;
           hba = mol1->nextHBondAcceptor(hbai)) {
        aInd = hba->getGlobalIndex();

        for (j = i, mol2 = sman.nextSelectedMolecule(j); mol2 != NULL;
             mol2 = sman.nextSelectedMolecule(j)) {
          for (hbd = mol2->beginHBondDonor(hbdi); hbd != NULL;
               hbd = mol2->nextHBondDonor(hbdi)) {
            hInd  = hbd->donatedHydrogen->getGlobalIndex();
            index = GIDtoH_[frame][hInd];

            if (acceptor_[frame][index] == aInd) {
              selected_[frame][index] = true;
            }
          }
        }
      }
    }
  }